

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

property_name_and_value * __thiscall
mjs::parser::parse_property_name_and_value
          (property_name_and_value *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  bool bVar2;
  token_type tVar3;
  int iVar4;
  pointer peVar5;
  identifier_expression *this_00;
  wstring *__lhs;
  mjs *this_01;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1;
  __tuple_element_t<1UL,_tuple<source_extend,_vector<basic_string<wchar_t>,_allocator<basic_string<wchar_t>_>_>,_unique_ptr<statement,_default_delete<statement>_>_>_>
  *this_02;
  size_type sVar6;
  wostream *pwVar7;
  expression *e;
  wchar_t *in_R9;
  wstring_view message;
  undefined1 auVar8 [16];
  undefined1 local_308 [52];
  undefined4 local_2d4;
  undefined1 local_2d0 [8];
  expression_ptr f;
  source_extend local_298;
  wostringstream local_280 [8];
  wostringstream _oss;
  size_t expected_args;
  type *block;
  type *params;
  type *extend;
  wstring local_b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  undefined1 local_70 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> id;
  expression_ptr new_p;
  bool is_get;
  wstring *p_id;
  undefined1 local_28 [8];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_20;
  expression_ptr p;
  parser *this_local;
  
  p._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
       (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&local_20);
  parse_property_name((parser *)local_28);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
            (&local_20,
             (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_28);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_28);
  if ((1 < (int)this->version_) && (tVar3 = current_token_type(this), tVar3 != colon)) {
    peVar5 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator->
                       (&local_20);
    iVar4 = (*(peVar5->super_syntax_node)._vptr_syntax_node[3])();
    if (iVar4 == 0) {
      this_00 = (identifier_expression *)
                std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                          (&local_20);
      __lhs = identifier_expression::id_abi_cxx11_(this_00);
      bVar1 = std::operator==(__lhs,L"get");
      if ((bVar1) || (bVar2 = std::operator==(__lhs,L"set"), bVar2)) {
        parse_property_name((parser *)((long)&id.field_2 + 8));
        std::operator+(&local_90,__lhs,L" ");
        this_01 = (mjs *)std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                         operator*((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                    *)((long)&id.field_2 + 8));
        property_name_string_abi_cxx11_(&local_b0,this_01,e);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_70,&local_90,&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_90);
        parse_function_abi_cxx11_
                  ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                    *)&extend,this);
        args_1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 std::
                 get<0ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                           ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                             *)&extend);
        this_02 = std::
                  get<1ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                            ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                              *)&extend);
        std::
        get<2ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                  ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                    *)&extend);
        sVar6 = std::
                vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ::size(this_02);
        if ((long)(int)(uint)!bVar1 != sVar6) {
          std::__cxx11::wostringstream::wostringstream(local_280);
          pwVar7 = std::operator<<((wostream *)local_280,"Wrong number of arguments to ");
          pwVar7 = std::operator<<(pwVar7,(wstring *)__lhs);
          pwVar7 = std::operator<<(pwVar7," ");
          sVar6 = std::
                  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ::size(this_02);
          pwVar7 = (wostream *)std::wostream::operator<<(pwVar7,sVar6);
          pwVar7 = std::operator<<(pwVar7," expected ");
          std::wostream::operator<<(pwVar7,(long)(int)(uint)!bVar1);
          current_extend(&local_298,this);
          std::__cxx11::wostringstream::str();
          auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&f);
          message._M_str = in_R9;
          message._M_len = auVar8._8_8_;
          syntax_error((parser *)"parse_property_name_and_value",(char *)0x449,(int)&local_298,
                       auVar8._0_8_,message);
        }
        make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring_const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                  ((parser *)local_2d0,(source_extend *)this,args_1,
                   (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)local_70,
                   (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)this_02);
        property_name_and_value::property_name_and_value
                  (__return_storage_ptr__,set - bVar1,(expression_ptr *)((long)&id.field_2 + 8),
                   (expression_ptr *)local_2d0);
        local_2d4 = 1;
        std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                  ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_2d0);
        std::
        tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
        ::~tuple((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)&extend);
        std::__cxx11::wstring::~wstring((wstring *)local_70);
        std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                  ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                   ((long)&id.field_2 + 8));
        goto LAB_001d3d77;
      }
    }
  }
  expect((token *)(local_308 + 8),this,colon,"parse_property_name_and_value",0x451);
  token::~token((token *)(local_308 + 8));
  parse_assignment_expression((parser *)local_308);
  property_name_and_value::property_name_and_value
            (__return_storage_ptr__,normal,&local_20,(expression_ptr *)local_308);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_308);
  local_2d4 = 1;
LAB_001d3d77:
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

property_name_and_value parser::parse_property_name_and_value() {
    expression_ptr p;
    {
        p = parse_property_name();
        // get/set i.e. accessor properties
        if (version_ >= version::es5 && current_token_type() != token_type::colon && p->type() == expression_type::identifier) {
            const auto& p_id = static_cast<const identifier_expression&>(*p).id();
            const bool is_get = p_id == L"get";
            if (is_get || p_id == L"set") {
                auto new_p = parse_property_name();
                const auto id = p_id + L" " + property_name_string(*new_p);
                auto [extend, params, block] = parse_function();
                const size_t expected_args = is_get ? 0 : 1;
                if (expected_args != params.size()) {
                    SYNTAX_ERROR("Wrong number of arguments to " << p_id << " " << params.size() << " expected " << expected_args);
                }

                auto f = make_expression<function_expression>(extend, id, std::move(params), std::move(block));
                return property_name_and_value{is_get ? property_assignment_type::get : property_assignment_type::set, std::move(new_p), std::move(f)};
            }
        }
    }
    EXPECT(token_type::colon);
    return property_name_and_value{property_assignment_type::normal, std::move(p), parse_assignment_expression()};
}